

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  Duration *value_local;
  TablePrinter *tp_local;
  
  anon_unknown_2::operator<<((ostream *)&tp->m_oss,value);
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, T const& value) {
        tp.m_oss << value;
        return tp;
    }